

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_16_toc_pcix(void)

{
  uint value;
  
  value = OPER_PCIX_16();
  m68ki_set_ccr(value);
  return;
}

Assistant:

static void m68k_op_move_16_toc_pcix(void)
{
	m68ki_set_ccr(OPER_PCIX_16());
}